

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void exprCodeBetween(Parse *pParse,Expr *pExpr,int dest,_func_void_Parse_ptr_Expr_ptr_int_int *xJump
                    ,int jumpIfNull)

{
  byte bVar1;
  sqlite3 *db;
  Expr *pEVar2;
  int iVar3;
  Expr *p;
  ExprList_item *pEVar4;
  int regFree1;
  Expr exprAnd;
  Expr compRight;
  Expr compLeft;
  int local_120;
  int local_11c;
  Expr local_118;
  Expr local_c8;
  Expr local_78;
  
  local_120 = 0;
  db = pParse->db;
  p = (Expr *)0x0;
  local_78.y.pTab = (Table *)0x0;
  local_78.iColumn = 0;
  local_78.iAgg = 0;
  local_78.w = (anon_union_4_2_009eaf8f_for_w)0x0;
  local_78.pAggInfo = (AggInfo *)0x0;
  local_78.x.pList = (ExprList *)0x0;
  local_78.nHeight = 0;
  local_78.iTable = 0;
  local_78.pLeft = (Expr *)0x0;
  local_78.pRight = (Expr *)0x0;
  local_78.op = '\0';
  local_78.affExpr = '\0';
  local_78.op2 = '\0';
  local_78._3_1_ = 0;
  local_78.flags = 0;
  local_78.u.zToken = (char *)0x0;
  local_c8.op = '\0';
  local_c8.affExpr = '\0';
  local_c8.op2 = '\0';
  local_c8._3_1_ = 0;
  local_c8.flags = 0;
  local_c8.u.zToken = (char *)0x0;
  local_c8.pLeft = (Expr *)0x0;
  local_c8.pRight = (Expr *)0x0;
  local_c8.x.pList = (ExprList *)0x0;
  local_c8.nHeight = 0;
  local_c8.iTable = 0;
  local_c8.iColumn = 0;
  local_c8.iAgg = 0;
  local_c8.w = (anon_union_4_2_009eaf8f_for_w)0x0;
  local_c8.pAggInfo = (AggInfo *)0x0;
  local_c8.y.pTab = (Table *)0x0;
  local_118.op = '\0';
  local_118.affExpr = '\0';
  local_118.op2 = '\0';
  local_118._3_1_ = 0;
  local_118.flags = 0;
  local_118.u.zToken = (char *)0x0;
  local_118.pLeft = (Expr *)0x0;
  local_118.pRight = (Expr *)0x0;
  local_118.x.pList = (ExprList *)0x0;
  local_118.nHeight = 0;
  local_118.iTable = 0;
  local_118.iColumn = 0;
  local_118.iAgg = 0;
  local_118.w = (anon_union_4_2_009eaf8f_for_w)0x0;
  local_118.pAggInfo = (AggInfo *)0x0;
  local_118.y.pTab = (Table *)0x0;
  local_11c = jumpIfNull;
  if (pExpr->pLeft != (Expr *)0x0) {
    p = exprDup(db,pExpr->pLeft,0,(u8 **)0x0);
  }
  if (db->mallocFailed == '\0') {
    local_118.op = ',';
    local_118.pLeft = &local_78;
    local_118.pRight = &local_c8;
    local_78.op = '9';
    local_78.pRight = *(Expr **)&((pExpr->x).pSelect)->iLimit;
    local_c8.op = '7';
    local_c8.pRight = (Expr *)((pExpr->x).pSelect)->pEList;
    local_c8.pLeft = p;
    local_78.pLeft = p;
    iVar3 = exprCodeVector(pParse,p,&local_120);
    pEVar2 = p;
    while (pEVar2 != (Expr *)0x0) {
      if ((pEVar2->flags & 0x82000) == 0) {
        pEVar2->op2 = pEVar2->op;
        pEVar2->op = 0xb0;
        pEVar2->iTable = iVar3;
        break;
      }
      if ((pEVar2->flags >> 0x13 & 1) == 0) {
        pEVar4 = (ExprList_item *)&pEVar2->pLeft;
      }
      else {
        pEVar4 = ((pEVar2->x).pList)->a;
      }
      pEVar2 = pEVar4->pExpr;
    }
    if (xJump == (_func_void_Parse_ptr_Expr_ptr_int_int *)0x0) {
      *(byte *)&p->flags = (byte)p->flags | 1;
      sqlite3ExprCodeTarget(pParse,&local_118,dest);
    }
    else {
      (*xJump)(pParse,&local_118,dest,local_11c);
    }
    if (local_120 != 0) {
      bVar1 = pParse->nTempReg;
      if ((ulong)bVar1 < 8) {
        pParse->nTempReg = bVar1 + 1;
        pParse->aTempReg[bVar1] = local_120;
      }
    }
  }
  if (p != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,p);
  }
  return;
}

Assistant:

static void exprCodeBetween(
  Parse *pParse,    /* Parsing and code generating context */
  Expr *pExpr,      /* The BETWEEN expression */
  int dest,         /* Jump destination or storage location */
  void (*xJump)(Parse*,Expr*,int,int), /* Action to take */
  int jumpIfNull    /* Take the jump if the BETWEEN is NULL */
){
  Expr exprAnd;     /* The AND operator in  x>=y AND x<=z  */
  Expr compLeft;    /* The  x>=y  term */
  Expr compRight;   /* The  x<=z  term */
  int regFree1 = 0; /* Temporary use register */
  Expr *pDel = 0;
  sqlite3 *db = pParse->db;

  memset(&compLeft, 0, sizeof(Expr));
  memset(&compRight, 0, sizeof(Expr));
  memset(&exprAnd, 0, sizeof(Expr));

  assert( ExprUseXList(pExpr) );
  pDel = sqlite3ExprDup(db, pExpr->pLeft, 0);
  if( db->mallocFailed==0 ){
    exprAnd.op = TK_AND;
    exprAnd.pLeft = &compLeft;
    exprAnd.pRight = &compRight;
    compLeft.op = TK_GE;
    compLeft.pLeft = pDel;
    compLeft.pRight = pExpr->x.pList->a[0].pExpr;
    compRight.op = TK_LE;
    compRight.pLeft = pDel;
    compRight.pRight = pExpr->x.pList->a[1].pExpr;
    exprToRegister(pDel, exprCodeVector(pParse, pDel, &regFree1));
    if( xJump ){
      xJump(pParse, &exprAnd, dest, jumpIfNull);
    }else{
      /* Mark the expression is being from the ON or USING clause of a join
      ** so that the sqlite3ExprCodeTarget() routine will not attempt to move
      ** it into the Parse.pConstExpr list.  We should use a new bit for this,
      ** for clarity, but we are out of bits in the Expr.flags field so we
      ** have to reuse the EP_OuterON bit.  Bummer. */
      pDel->flags |= EP_OuterON;
      sqlite3ExprCodeTarget(pParse, &exprAnd, dest);
    }
    sqlite3ReleaseTempReg(pParse, regFree1);
  }
  sqlite3ExprDelete(db, pDel);

  /* Ensure adequate test coverage */
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull==0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull==0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull!=0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull!=0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull==0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull==0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull!=0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull!=0 && regFree1!=0 );
  testcase( xJump==0 );
}